

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O2

int nifti_free_extensions(nifti_image *nim)

{
  nifti1_extension *pnVar1;
  ulong uVar2;
  long lVar3;
  long lVar4;
  
  if (nim == (nifti_image *)0x0) {
    return -1;
  }
  uVar2 = (ulong)(uint)nim->num_ext;
  pnVar1 = nim->ext_list;
  if (nim->num_ext < 1) {
    if (pnVar1 != (nifti1_extension *)0x0 && 0 < g_opts_0) goto LAB_0011554b;
  }
  else if (pnVar1 == (nifti1_extension *)0x0) {
    if (g_opts_0 < 1) goto LAB_00115532;
    pnVar1 = (nifti1_extension *)0x0;
LAB_0011554b:
    fprintf(_stderr,"** warning: nifti extension num/ptr mismatch (%d,%p)\n",uVar2,pnVar1);
  }
  else {
    lVar3 = 8;
    for (lVar4 = 0; lVar4 < (int)uVar2; lVar4 = lVar4 + 1) {
      free(*(void **)((long)&nim->ext_list->esize + lVar3));
      uVar2 = (ulong)(uint)nim->num_ext;
      lVar3 = lVar3 + 0x10;
    }
    free(nim->ext_list);
  }
  if (2 < g_opts_0) {
    fprintf(_stderr,"+d free\'d %d extension(s)\n",(ulong)(uint)nim->num_ext);
  }
LAB_00115532:
  nim->num_ext = 0;
  nim->ext_list = (nifti1_extension *)0x0;
  return 0;
}

Assistant:

int nifti_free_extensions( nifti_image *nim )
{
   int c ;
   if( nim == NULL ) return -1;
   if( nim->num_ext > 0 && nim->ext_list ){
      for( c = 0; c < nim->num_ext; c++ )
         if ( nim->ext_list[c].edata ) free(nim->ext_list[c].edata);
      free(nim->ext_list);
   }
   /* or if it is inconsistent, warn the user (if we are not in quiet mode) */
   else if ( (nim->num_ext > 0 || nim->ext_list != NULL) && (g_opts.debug > 0) )
      fprintf(stderr,"** warning: nifti extension num/ptr mismatch (%d,%p)\n",
              nim->num_ext, (void *)nim->ext_list);

   if( g_opts.debug > 2 )
      fprintf(stderr,"+d free'd %d extension(s)\n", nim->num_ext);

   nim->num_ext = 0;
   nim->ext_list = NULL;

   return 0;
}